

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int check_password_digest
              (char *method,char *ha1,char *uri,char *nonce,char *nc,char *cnonce,char *qop,
              char *response)

{
  int iVar1;
  size_t sVar2;
  char local_a8 [8];
  char expected_response [33];
  char local_78 [8];
  char ha2 [33];
  char *cnonce_local;
  char *nc_local;
  char *nonce_local;
  char *uri_local;
  char *ha1_local;
  char *method_local;
  
  if ((((method == (char *)0x0) || (nonce == (char *)0x0)) || (nc == (char *)0x0)) ||
     (((cnonce == (char *)0x0 || (qop == (char *)0x0)) || (response == (char *)0x0)))) {
    method_local._4_4_ = 0;
  }
  else {
    sVar2 = strlen(response);
    if (sVar2 == 0x20) {
      mg_md5(local_78,method,":",uri,0);
      mg_md5(local_a8,ha1,":",nonce,":",nc,":",cnonce,":",qop,":",local_78,0);
      iVar1 = mg_strcasecmp(response,local_a8);
      method_local._4_4_ = (uint)(iVar1 == 0);
    }
    else {
      method_local._4_4_ = 0;
    }
  }
  return method_local._4_4_;
}

Assistant:

static int
check_password_digest(const char *method,
                      const char *ha1,
                      const char *uri,
                      const char *nonce,
                      const char *nc,
                      const char *cnonce,
                      const char *qop,
                      const char *response)
{
	char ha2[32 + 1], expected_response[32 + 1];

	/* Some of the parameters may be NULL */
	if ((method == NULL) || (nonce == NULL) || (nc == NULL) || (cnonce == NULL)
	    || (qop == NULL) || (response == NULL)) {
		return 0;
	}

	/* NOTE(lsm): due to a bug in MSIE, we do not compare the URI */
	if (strlen(response) != 32) {
		return 0;
	}

	mg_md5(ha2, method, ":", uri, NULL);
	mg_md5(expected_response,
	       ha1,
	       ":",
	       nonce,
	       ":",
	       nc,
	       ":",
	       cnonce,
	       ":",
	       qop,
	       ":",
	       ha2,
	       NULL);

	return mg_strcasecmp(response, expected_response) == 0;
}